

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

void rx_summary_print(rx_summary *summary)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  rx__log_style style;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  char *local_48;
  char *failure_msg;
  rx_failure *failure;
  char *style_end;
  char *style_begin;
  ulong uStack_18;
  int passed;
  size_t i;
  rx_summary *summary_local;
  
  i = (size_t)summary;
  if (summary == (rx_summary *)0x0) {
    __assert_fail("summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18f5,"void rx_summary_print(const struct rx_summary *)");
  }
  if (summary->test_case == (rx_test_case *)0x0) {
    __assert_fail("summary->test_case != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18f6,"void rx_summary_print(const struct rx_summary *)");
  }
  if (summary->test_case->suite_name == (char *)0x0) {
    __assert_fail("summary->test_case->suite_name != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18f7,"void rx_summary_print(const struct rx_summary *)");
  }
  if (summary->test_case->name != (char *)0x0) {
    if (summary->failures != (rx_failure *)0x0) {
      style_begin._4_4_ = (uint)(summary->failure_count == 0);
      iVar2 = fileno(_stderr);
      iVar2 = isatty(iVar2);
      if (iVar2 == 0) {
        failure = (rx_failure *)0x10b5ef;
        style_end = "";
      }
      else {
        style = RX__LOG_STYLE_BRIGHT_RED;
        if (style_begin._4_4_ != 0) {
          style = RX__LOG_STYLE_BRIGHT_GREEN;
        }
        rx__log_style_get_ansi_code(&style_end,style);
        rx__log_style_get_ansi_code((char **)&failure,RX__LOG_STYLE_RESET);
      }
      pcVar4 = "FAILED";
      if (style_begin._4_4_ != 0) {
        pcVar4 = "PASSED";
      }
      uVar6 = (*(undefined8 **)i)[1];
      uVar1 = *(undefined8 *)(i + 0x30);
      auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      fprintf(_stderr,"[%s%s%s] \"%s\" / \"%s\" (%f ms)\n",
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06,style_end,
              pcVar4,failure,**(undefined8 **)i,uVar6);
      for (uStack_18 = 0; uStack_18 < *(ulong *)(i + 0x20); uStack_18 = uStack_18 + 1) {
        puVar3 = (undefined8 *)(*(long *)(i + 0x28) + uStack_18 * 0x20);
        if (puVar3[2] == 0) {
          local_48 = "";
        }
        else {
          local_48 = (char *)puVar3[2];
        }
        if (puVar3[3] == 0) {
          pcVar4 = "nonfatal";
          if (*(int *)((long)puVar3 + 0xc) == 1) {
            pcVar4 = "fatal";
          }
          fprintf(_stderr,"%s:%d: %s test failure: %s\n",*puVar3,(ulong)*(uint *)(puVar3 + 1),pcVar4
                  ,local_48,uVar6);
        }
        else {
          pcVar4 = "nonfatal";
          if (*(int *)((long)puVar3 + 0xc) == 1) {
            pcVar4 = "fatal";
          }
          uVar6 = puVar3[3];
          fprintf(_stderr,"%s:%d: %s test failure: %s\n%s\n",*puVar3,(ulong)*(uint *)(puVar3 + 1),
                  pcVar4,local_48,uVar6);
        }
      }
      return;
    }
    __assert_fail("summary->failures != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18f9,"void rx_summary_print(const struct rx_summary *)");
  }
  __assert_fail("summary->test_case->name != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x18f8,"void rx_summary_print(const struct rx_summary *)");
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE void
rx_summary_print(const struct rx_summary *summary)
{
    size_t i;
    int passed;
    const char *style_begin;
    const char *style_end;

    RX_ASSERT(summary != NULL);
    RX_ASSERT(summary->test_case != NULL);
    RX_ASSERT(summary->test_case->suite_name != NULL);
    RX_ASSERT(summary->test_case->name != NULL);
    RX_ASSERT(summary->failures != NULL);

    passed = summary->failure_count == 0;

#if RX__LOG_STYLING
    if (RX__ISATTY(RX__FILENO(stderr))) {
        rx__log_style_get_ansi_code(
            &style_begin,
            passed ? RX__LOG_STYLE_BRIGHT_GREEN : RX__LOG_STYLE_BRIGHT_RED);
        rx__log_style_get_ansi_code(&style_end, RX__LOG_STYLE_RESET);
    } else {
        style_begin = style_end = "";
    }
#else
    style_begin = style_end = "";
#endif

    fprintf(stderr,
            "[%s%s%s] \"%s\" / \"%s\" (%f ms)\n",
            style_begin,
            passed ? "PASSED" : "FAILED",
            style_end,
            summary->test_case->suite_name,
            summary->test_case->name,
            (double)summary->elapsed * (1000.0 / RX__TICKS_PER_SECOND));

    for (i = 0; i < summary->failure_count; ++i) {
        const struct rx_failure *failure;
        const char *failure_msg;

        failure = &summary->failures[i];
        failure_msg = failure->msg == NULL ? "" : failure->msg;

        if (failure->diagnostic_msg != NULL) {
            fprintf(stderr,
                    "%s:%d: %s test failure: %s\n%s\n",
                    failure->file,
                    failure->line,
                    failure->severity == RX_FATAL ? "fatal" : "nonfatal",
                    failure_msg,
                    failure->diagnostic_msg);
        } else {
            fprintf(stderr,
                    "%s:%d: %s test failure: %s\n",
                    failure->file,
                    failure->line,
                    failure->severity == RX_FATAL ? "fatal" : "nonfatal",
                    failure_msg);
        }
    }
}